

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::JunitReporter::testGroupEnded(JunitReporter *this,TestGroupStats *testGroupStats)

{
  long lVar1;
  undefined1 auVar2 [16];
  timeval t;
  timeval local_28;
  
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  lVar1 = (local_28.tv_sec * 1000000 + local_28.tv_usec) - (this->suiteTimer).m_ticks;
  auVar2._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar2._0_8_ = lVar1;
  auVar2._12_4_ = 0x45300000;
  CumulativeReporterBase::testGroupEnded(&this->super_CumulativeReporterBase,testGroupStats);
  writeGroup(this,(this->super_CumulativeReporterBase).m_testGroups.
                  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].m_p,
             ((auVar2._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / 1000000.0);
  return;
}

Assistant:

virtual void testGroupEnded( TestGroupStats const& testGroupStats ) {
            double suiteTime = suiteTimer.getElapsedSeconds();
            CumulativeReporterBase::testGroupEnded( testGroupStats );
            writeGroup( *m_testGroups.back(), suiteTime );
        }